

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> * __thiscall
CLI::App::get_options
          (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__return_storage_ptr__
          ,App *this,function<bool_(const_CLI::Option_*)> *filter)

{
  pointer puVar1;
  Option **ppOVar2;
  pointer psVar3;
  App *this_00;
  pointer puVar4;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  _Var5;
  pointer ppOVar6;
  pointer ppOVar7;
  pointer psVar8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> subcopts;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_68;
  _Any_data local_50;
  code *local_40;
  
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
            (__return_storage_ptr__,
             (long)(this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_68);
  puVar4 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    ppOVar7 = (__return_storage_ptr__->
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    do {
      *ppOVar7 = (puVar4->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      puVar4 = puVar4 + 1;
      ppOVar7 = ppOVar7 + 1;
    } while (puVar4 != puVar1);
  }
  if ((filter->super__Function_base)._M_manager != (_Manager_type)0x0) {
    _Var5 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(CLI::Option_const*)_1_>>
                      ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                        )(__return_storage_ptr__->
                         super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                        )(__return_storage_ptr__->
                         super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_helics_external_CLI11_CLI11_hpp:8609:38)>
                        )filter);
    ppOVar2 = (__return_storage_ptr__->
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>)._M_impl
              .super__Vector_impl_data._M_finish;
    if ((_Var5._M_current != ppOVar2) &&
       (ppOVar7 = (__return_storage_ptr__->
                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish,
       ppOVar6 = (pointer)((long)_Var5._M_current + ((long)ppOVar7 - (long)ppOVar2)),
       ppOVar7 != ppOVar6)) {
      (__return_storage_ptr__->
      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppOVar6;
    }
  }
  psVar8 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar3) {
    do {
      this_00 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((this_00->name_)._M_string_length == 0) && ((this_00->group_)._M_string_length != 0)) &&
         (*(this_00->group_)._M_dataplus._M_p == '+')) {
        std::function<bool_(const_CLI::Option_*)>::function
                  ((function<bool_(const_CLI::Option_*)> *)&local_50,filter);
        get_options(&local_68,this_00,(function<bool_(const_CLI::Option_*)> *)&local_50);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        ::std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>>
                  ((vector<CLI::Option_const*,std::allocator<CLI::Option_const*>> *)
                   __return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   local_68.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_68.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        if (local_68.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::vector<const Option *> App::get_options(const std::function<bool(const Option *)> filter) const {
    std::vector<const Option *> options(options_.size());
    std::transform(
        std::begin(options_), std::end(options_), std::begin(options), [](const Option_p &val) { return val.get(); });

    if(filter) {
        options.erase(std::remove_if(std::begin(options),
                                     std::end(options),
                                     [&filter](const Option *opt) { return !filter(opt); }),
                      std::end(options));
    }
    for(const auto &subcp : subcommands_) {
        // also check down into nameless subcommands
        const App *subc = subcp.get();
        if(subc->get_name().empty() && !subc->get_group().empty() && subc->get_group().front() == '+') {
            std::vector<const Option *> subcopts = subc->get_options(filter);
            options.insert(options.end(), subcopts.begin(), subcopts.end());
        }
    }
    return options;
}